

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O3

ComparisonResult __thiscall
google::protobuf::util::SimpleFieldComparator::SimpleCompare
          (SimpleFieldComparator *this,Message *message_1,Message *message_2,FieldDescriptor *field,
          int index_1,int index_2,FieldContext *param_6)

{
  size_t __n;
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  EnumValueDescriptor *pEVar8;
  EnumValueDescriptor *pEVar9;
  string *psVar10;
  string *psVar11;
  LogMessage *this_00;
  undefined8 extraout_RAX;
  Reflection *this_01;
  Reflection *this_02;
  ComparisonResult CVar12;
  bool bVar13;
  undefined4 uVar14;
  float value_1;
  float value_2;
  double value_1_00;
  double dVar15;
  undefined4 uVar16;
  Metadata MVar17;
  string scratch1;
  string scratch2;
  string local_70;
  string local_50;
  
  MVar17 = Message::GetMetadata(message_1);
  this_01 = MVar17.reflection;
  MVar17 = Message::GetMetadata(message_2);
  this_02 = MVar17.reflection;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      if ((bVar2 & 0x20) == 0) {
        uVar3 = Reflection::GetInt32(this_01,message_1,field);
        uVar4 = Reflection::GetInt32(this_02,message_2,field);
      }
      else {
        uVar3 = Reflection::GetRepeatedInt32(this_01,message_1,field,index_1);
        uVar4 = Reflection::GetRepeatedInt32(this_02,message_2,field,index_2);
      }
LAB_0030960b:
      bVar13 = uVar3 == uVar4;
LAB_0030962c:
      return (uint)!bVar13;
    }
    goto LAB_00309804;
  case 2:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      if ((bVar2 & 0x20) == 0) {
        uVar6 = Reflection::GetInt64(this_01,message_1,field);
        uVar7 = Reflection::GetInt64(this_02,message_2,field);
      }
      else {
        uVar6 = Reflection::GetRepeatedInt64(this_01,message_1,field,index_1);
        uVar7 = Reflection::GetRepeatedInt64(this_02,message_2,field,index_2);
      }
LAB_00309627:
      bVar13 = uVar6 == uVar7;
      goto LAB_0030962c;
    }
    goto LAB_00309819;
  case 3:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      if ((bVar2 & 0x20) == 0) {
        uVar3 = Reflection::GetUInt32(this_01,message_1,field);
        uVar4 = Reflection::GetUInt32(this_02,message_2,field);
      }
      else {
        uVar3 = Reflection::GetRepeatedUInt32(this_01,message_1,field,index_1);
        uVar4 = Reflection::GetRepeatedUInt32(this_02,message_2,field,index_2);
      }
      goto LAB_0030960b;
    }
    break;
  case 4:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      if ((bVar2 & 0x20) == 0) {
        uVar6 = Reflection::GetUInt64(this_01,message_1,field);
        uVar7 = Reflection::GetUInt64(this_02,message_2,field);
      }
      else {
        uVar6 = Reflection::GetRepeatedUInt64(this_01,message_1,field,index_1);
        uVar7 = Reflection::GetRepeatedUInt64(this_02,message_2,field,index_2);
      }
      goto LAB_00309627;
    }
    goto LAB_003097da;
  case 5:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      if ((bVar2 & 0x20) == 0) {
        value_1_00 = Reflection::GetDouble(this_01,message_1,field);
        dVar15 = Reflection::GetDouble(this_02,message_2,field);
        uVar14 = SUB84(dVar15,0);
        uVar16 = (undefined4)((ulong)dVar15 >> 0x20);
      }
      else {
        value_1_00 = Reflection::GetRepeatedDouble(this_01,message_1,field,index_1);
        dVar15 = Reflection::GetRepeatedDouble(this_02,message_2,field,index_2);
        uVar14 = SUB84(dVar15,0);
        uVar16 = (undefined4)((ulong)dVar15 >> 0x20);
      }
      bVar13 = CompareDoubleOrFloat<double>(this,field,value_1_00,(double)CONCAT44(uVar16,uVar14));
LAB_0030965e:
      bVar2 = bVar13 ^ 1;
LAB_0030967a:
      return (uint)bVar2;
    }
    SimpleCompare();
    break;
  case 6:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      if ((bVar2 & 0x20) == 0) {
        value_1 = Reflection::GetFloat(this_01,message_1,field);
        value_2 = Reflection::GetFloat(this_02,message_2,field);
      }
      else {
        value_1 = Reflection::GetRepeatedFloat(this_01,message_1,field,index_1);
        value_2 = Reflection::GetRepeatedFloat(this_02,message_2,field,index_2);
      }
      bVar13 = CompareDoubleOrFloat<float>(this,field,value_1,value_2);
      goto LAB_0030965e;
    }
    goto LAB_0030982e;
  case 7:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      if ((bVar2 & 0x20) == 0) {
        bVar13 = Reflection::GetBool(this_01,message_1,field);
        bVar1 = Reflection::GetBool(this_02,message_2,field);
      }
      else {
        bVar13 = Reflection::GetRepeatedBool(this_01,message_1,field,index_1);
        bVar1 = Reflection::GetRepeatedBool(this_02,message_2,field,index_2);
      }
      bVar2 = bVar1 ^ bVar13;
      goto LAB_0030967a;
    }
    goto LAB_00309843;
  case 8:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      if ((bVar2 & 0x20) == 0) {
        pEVar8 = Reflection::GetEnum(this_01,message_1,field);
        pEVar9 = Reflection::GetEnum(this_02,message_2,field);
      }
      else {
        pEVar8 = Reflection::GetRepeatedEnum(this_01,message_1,field,index_1);
        pEVar9 = Reflection::GetRepeatedEnum(this_02,message_2,field,index_2);
      }
      bVar13 = pEVar8->number_ == pEVar9->number_;
      goto LAB_0030962c;
    }
    goto LAB_003097ef;
  case 9:
    bVar2 = field->field_0x1;
    if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      if ((bVar2 & 0x20) == 0) {
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        psVar10 = Reflection::GetStringReference(this_01,message_1,field,&local_70);
        psVar11 = Reflection::GetStringReference(this_02,message_2,field,&local_50);
      }
      else {
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        psVar10 = Reflection::GetRepeatedStringReference(this_01,message_1,field,index_1,&local_70);
        psVar11 = Reflection::GetRepeatedStringReference(this_02,message_2,field,index_2,&local_50);
      }
      __n = psVar10->_M_string_length;
      CVar12 = DIFFERENT;
      if (__n == psVar11->_M_string_length) {
        if (__n == 0) {
          CVar12 = SAME;
        }
        else {
          iVar5 = bcmp((psVar10->_M_dataplus)._M_p,(psVar11->_M_dataplus)._M_p,__n);
          CVar12 = (ComparisonResult)(iVar5 != 0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return CVar12;
      }
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
      return CVar12;
    }
    goto LAB_00309858;
  case 10:
    return RECURSE;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/util/field_comparator.cc"
               ,0x84);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (&local_70,0x1d,"No comparison code for field ");
    this_00 = (LogMessage *)
              absl::lts_20240722::log_internal::LogMessage::operator<<
                        ((LogMessage *)&local_70,(string *)(field->all_names_ + 1));
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (this_00,0xe," of CppType = ");
    local_50._M_dataplus._M_p._0_4_ =
         *(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
    absl::lts_20240722::log_internal::LogMessage::
    operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
              (this_00,(CppType *)&local_50);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_70);
  }
  SimpleCompare();
LAB_003097da:
  SimpleCompare();
LAB_003097ef:
  SimpleCompare();
LAB_00309804:
  SimpleCompare();
LAB_00309819:
  SimpleCompare();
LAB_0030982e:
  SimpleCompare();
LAB_00309843:
  SimpleCompare();
LAB_00309858:
  SimpleCompare();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

FieldComparator::ComparisonResult SimpleFieldComparator::SimpleCompare(
    const Message& message_1, const Message& message_2,
    const FieldDescriptor* field, int index_1, int index_2,
    const util::FieldContext* /*field_context*/) {
  const Reflection* reflection_1 = message_1.GetReflection();
  const Reflection* reflection_2 = message_2.GetReflection();

  switch (field->cpp_type()) {
#define COMPARE_FIELD(METHOD)                                                 \
  if (field->is_repeated()) {                                                 \
    return ResultFromBoolean(Compare##METHOD(                                 \
        *field, reflection_1->GetRepeated##METHOD(message_1, field, index_1), \
        reflection_2->GetRepeated##METHOD(message_2, field, index_2)));       \
  } else {                                                                    \
    return ResultFromBoolean(                                                 \
        Compare##METHOD(*field, reflection_1->Get##METHOD(message_1, field),  \
                        reflection_2->Get##METHOD(message_2, field)));        \
  }                                                                           \
  break;  // Make sure no fall-through is introduced.

    case FieldDescriptor::CPPTYPE_BOOL:
      COMPARE_FIELD(Bool);
    case FieldDescriptor::CPPTYPE_DOUBLE:
      COMPARE_FIELD(Double);
    case FieldDescriptor::CPPTYPE_ENUM:
      COMPARE_FIELD(Enum);
    case FieldDescriptor::CPPTYPE_FLOAT:
      COMPARE_FIELD(Float);
    case FieldDescriptor::CPPTYPE_INT32:
      COMPARE_FIELD(Int32);
    case FieldDescriptor::CPPTYPE_INT64:
      COMPARE_FIELD(Int64);
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->is_repeated()) {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(
            CompareString(*field,
                          reflection_1->GetRepeatedStringReference(
                              message_1, field, index_1, &scratch1),
                          reflection_2->GetRepeatedStringReference(
                              message_2, field, index_2, &scratch2)));
      } else {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(CompareString(
            *field,
            reflection_1->GetStringReference(message_1, field, &scratch1),
            reflection_2->GetStringReference(message_2, field, &scratch2)));
      }
      break;
    case FieldDescriptor::CPPTYPE_UINT32:
      COMPARE_FIELD(UInt32);
    case FieldDescriptor::CPPTYPE_UINT64:
      COMPARE_FIELD(UInt64);

#undef COMPARE_FIELD

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return RECURSE;

    default:
      ABSL_LOG(FATAL) << "No comparison code for field " << field->full_name()
                      << " of CppType = " << field->cpp_type();
      return DIFFERENT;
  }
}